

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_block_cyclic(Integer g_a,Integer *dims)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  Integer ga_handle;
  Integer jsize;
  Integer i;
  Integer in_stack_00000178;
  char *in_stack_00000180;
  long local_20;
  long local_18;
  
  lVar1 = in_RDI + 1000;
  if (GA[lVar1].actv == 1) {
    pnga_error(in_stack_00000180,in_stack_00000178);
  }
  if (GA[lVar1].ndim < 1) {
    pnga_error(in_stack_00000180,in_stack_00000178);
  }
  if (GA[lVar1].distr_type != 0) {
    pnga_error(in_stack_00000180,in_stack_00000178);
  }
  GA[lVar1].distr_type = 1;
  for (local_18 = 0; local_18 < GA[lVar1].ndim; local_18 = local_18 + 1) {
    if (*(long *)(in_RSI + local_18 * 8) < 1) {
      pnga_error(in_stack_00000180,in_stack_00000178);
    }
    GA[lVar1].block_dims[local_18] = *(C_Integer *)(in_RSI + local_18 * 8);
    local_20 = GA[lVar1].dims[local_18] / *(long *)(in_RSI + local_18 * 8);
    if (GA[lVar1].dims[local_18] % *(long *)(in_RSI + local_18 * 8) != 0) {
      local_20 = local_20 + 1;
    }
    GA[lVar1].num_blocks[local_18] = local_20;
  }
  local_20 = 1;
  for (local_18 = 0; local_18 < GA[lVar1].ndim; local_18 = local_18 + 1) {
    local_20 = GA[lVar1].num_blocks[local_18] * local_20;
  }
  GA[lVar1].block_total = local_20;
  return;
}

Assistant:

void pnga_set_block_cyclic(Integer g_a, Integer *dims)
{
  Integer i, jsize;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set block-cyclic data distribution on array that has been allocated",0);
  if (!(GA[ga_handle].ndim > 0))
    pnga_error("Cannot set block-cyclic data distribution if array size not set",0);
  if (GA[ga_handle].distr_type != REGULAR)
    pnga_error("Cannot reset block-cyclic data distribution on array that has been set",0);
  GA[ga_handle].distr_type = BLOCK_CYCLIC;
  /* evaluate number of blocks in each dimension */
  for (i=0; i<GA[ga_handle].ndim; i++) {
    if (dims[i] < 1)
      pnga_error("Block dimensions must all be greater than zero",0);
    GA[ga_handle].block_dims[i] = dims[i];
    jsize = GA[ga_handle].dims[i]/dims[i];
    if (GA[ga_handle].dims[i]%dims[i] != 0) jsize++;
    GA[ga_handle].num_blocks[i] = jsize;
  }
  jsize = 1;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    jsize *= GA[ga_handle].num_blocks[i];
  }
  GA[ga_handle].block_total = jsize;
}